

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_setup_multiple_outputs2(APITests *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  long lVar5;
  uint uVar6;
  long *plVar7;
  uint uVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  string __str;
  allocator_type local_aa;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58 [2];
  long local_48 [2];
  int local_38 [2];
  
  GPIO::setmode(BOARD);
  uVar1 = (this->pin_data).out_a;
  uVar6 = -uVar1;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  __len = 1;
  uVar8 = 1;
  if (9 < uVar6) {
    uVar4 = (ulong)uVar6;
    uVar3 = 4;
    do {
      uVar8 = uVar3;
      uVar2 = (uint)uVar4;
      if (uVar2 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00112b65;
      }
      if (uVar2 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00112b65;
      }
      if (uVar2 < 10000) goto LAB_00112b65;
      uVar4 = uVar4 / 10000;
      uVar3 = uVar8 + 4;
    } while (99999 < uVar2);
    uVar8 = uVar8 + 1;
  }
LAB_00112b65:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar8 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p + (uVar1 >> 0x1f),uVar8,uVar6);
  uVar1 = (this->pin_data).out_b;
  uVar6 = -uVar1;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  if (9 < uVar6) {
    uVar4 = (ulong)uVar6;
    uVar8 = 4;
    do {
      __len = uVar8;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00112bf6;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00112bf6;
      }
      if (uVar3 < 10000) goto LAB_00112bf6;
      uVar4 = uVar4 / 10000;
      uVar8 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00112bf6:
  plVar7 = local_48;
  local_58[0] = plVar7;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_58[0]),__len,uVar6);
  __l._M_len = 2;
  __l._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l,&local_a9);
  local_38[0] = 0;
  local_38[1] = 1;
  __l_00._M_len = 2;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_00,&local_aa);
  GPIO::setup((vector *)&local_90,OUT,(vector *)&local_a8);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  lVar5 = -0x40;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs2()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({std::to_string(pin_data.out_a), std::to_string(pin_data.out_b)}, GPIO::OUT, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }